

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O3

path * mp::path::temp_directory_path(void)

{
  char *pcVar1;
  size_t sVar2;
  path *in_RDI;
  char *__s;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar1 = getenv("TMPDIR");
  __s = "/tmp";
  if (pcVar1 != (char *)0x0) {
    __s = pcVar1;
  }
  local_40[0] = local_30;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,__s,__s + sVar2);
  (in_RDI->str_)._M_dataplus._M_p = (pointer)&(in_RDI->str_).field_2;
  std::__cxx11::string::_M_construct<char*>();
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return in_RDI;
}

Assistant:

path path::temp_directory_path() {
  const char *dir = std::getenv("TMPDIR");
  if (!dir) {
# ifdef P_tmpdir
    dir = P_tmpdir;
# else
    dir = "/tmp";
# endif
  }
  return path(dir);
}